

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walHashGet(Wal *pWal,int iHash,WalHashLoc *pLoc)

{
  u32 **ppPage;
  int iVar1;
  u32 *puVar2;
  
  ppPage = &pLoc->aPgno;
  if (iHash < pWal->nWiData) {
    puVar2 = pWal->apWiData[iHash];
    *ppPage = puVar2;
    iVar1 = 0;
    if (puVar2 != (u32 *)0x0) goto LAB_0014bb4d;
  }
  iVar1 = walIndexPageRealloc(pWal,iHash,ppPage);
  puVar2 = *ppPage;
  if (puVar2 == (u32 *)0x0) {
    return iVar1 + (uint)(iVar1 == 0);
  }
LAB_0014bb4d:
  pLoc->aHash = (ht_slot *)(puVar2 + 0x1000);
  if (iHash == 0) {
    pLoc->aPgno = puVar2 + 0x22;
    pLoc->iZero = 0;
  }
  else {
    pLoc->iZero = iHash * 0x1000 - 0x22;
  }
  return iVar1;
}

Assistant:

static int walHashGet(
  Wal *pWal,                      /* WAL handle */
  int iHash,                      /* Find the iHash'th table */
  WalHashLoc *pLoc                /* OUT: Hash table location */
){
  int rc;                         /* Return code */

  rc = walIndexPage(pWal, iHash, &pLoc->aPgno);
  assert( rc==SQLITE_OK || iHash>0 );

  if( pLoc->aPgno ){
    pLoc->aHash = (volatile ht_slot *)&pLoc->aPgno[HASHTABLE_NPAGE];
    if( iHash==0 ){
      pLoc->aPgno = &pLoc->aPgno[WALINDEX_HDR_SIZE/sizeof(u32)];
      pLoc->iZero = 0;
    }else{
      pLoc->iZero = HASHTABLE_NPAGE_ONE + (iHash-1)*HASHTABLE_NPAGE;
    }
  }else if( NEVER(rc==SQLITE_OK) ){
    rc = SQLITE_ERROR;
  }
  return rc;
}